

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseStorage.h
# Opt level: O0

void __thiscall
Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
          (DenseStorage<double,__1,__1,__1,_0> *this,DenseIndex size,DenseIndex nbRows,
          DenseIndex nbCols)

{
  double *pdVar1;
  DenseIndex nbCols_local;
  DenseIndex nbRows_local;
  DenseIndex size_local;
  DenseStorage<double,__1,__1,__1,_0> *this_local;
  
  pdVar1 = internal::conditional_aligned_new_auto<double,true>(size);
  this->m_data = pdVar1;
  this->m_rows = nbRows;
  this->m_cols = nbCols;
  return;
}

Assistant:

DenseStorage(DenseIndex size, DenseIndex nbRows, DenseIndex nbCols)
      : m_data(internal::conditional_aligned_new_auto<T,(_Options&DontAlign)==0>(size)), m_rows(nbRows), m_cols(nbCols)
    { EIGEN_INTERNAL_DENSE_STORAGE_CTOR_PLUGIN }